

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::load_texture(Model *this,string *filename,string *suffix,TGAImage *img)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string texfile;
  size_t dot;
  TGAImage *img_local;
  string *suffix_local;
  string *filename_local;
  Model *this_local;
  
  texfile.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)filename,0x110bb7);
  if (texfile.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)filename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,suffix);
    std::__cxx11::string::~string((string *)&local_70);
    poVar2 = std::operator<<((ostream *)&std::cerr,"texture file ");
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    poVar2 = std::operator<<(poVar2," loading ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar3,&local_a1);
    bVar1 = TGAImage::read_tga_file(img,&local_a0);
    pcVar3 = "failed";
    if (bVar1) {
      pcVar3 = "ok";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    TGAImage::flip_vertically(img);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void Model::load_texture(std::string filename, const std::string suffix, TGAImage &img)
{
    size_t dot = filename.find_last_of(".");
    if (dot == std::string::npos) return;
    std::string texfile = filename.substr(0, dot) + suffix;
    std::cerr << "texture file " << texfile << " loading "
              << (img.read_tga_file(texfile.c_str()) ? "ok" : "failed") << std::endl;
    img.flip_vertically();
}